

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinNative
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  HeapEntity *pHVar1;
  Allocator *this_00;
  AST *pAVar2;
  Interpreter *pIVar3;
  iterator iVar4;
  Identifier *pIVar5;
  ulong uVar6;
  pointer pPVar7;
  allocator_type *in_RCX;
  ulong uVar8;
  pointer pPVar9;
  ulong uVar10;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  *this_01;
  pointer pPVar11;
  pointer pPVar12;
  _Base_ptr s;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar13;
  string builtin_name;
  pointer local_c0;
  Params local_b8;
  UString local_a0;
  Interpreter *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_68;
  string local_50;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"native","");
  local_50._M_dataplus._M_p._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_68,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&local_a0,args,&local_68);
  if (local_68.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pHVar1 = (((args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start)->v).h;
  encode_utf8(&local_50,(internal *)pHVar1[1]._vptr_HeapEntity,*(UString **)&pHVar1[1].mark);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
          ::find(&(this->nativeCallbacks)._M_t,&local_50);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->nativeCallbacks)._M_t._M_impl.super__Rb_tree_header) {
    (this->scratch).t = NULL_TYPE;
  }
  else {
    s = iVar4._M_node[2]._M_left;
    local_70 = iVar4._M_node[2]._M_right;
    local_b8.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80 = this;
    if (s == local_70) {
      local_c0 = (pointer)0x0;
    }
    else {
      pPVar11 = (pointer)0x0;
      pPVar12 = (pointer)0x0;
      local_c0 = (pointer)0x0;
      do {
        this_00 = local_80->alloc;
        decode_utf8(&local_a0,(string *)s);
        pIVar5 = Allocator::makeIdentifier(this_00,&local_a0);
        if (pPVar12 == pPVar11) {
          uVar10 = (long)pPVar11 - (long)local_c0;
          local_78 = s;
          if (uVar10 == 0x7ffffffffffffff0) {
            local_b8.
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
            ._M_impl.super__Vector_impl_data._M_start = local_c0;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar6 = (long)uVar10 >> 4;
          uVar8 = uVar6;
          if (pPVar11 == local_c0) {
            uVar8 = 1;
          }
          this_01 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                     *)(uVar8 + uVar6);
          if ((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
               *)0x7fffffffffffffe < this_01) {
            this_01 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                       *)0x7ffffffffffffff;
          }
          if (CARRY8(uVar8,uVar6)) {
            this_01 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                       *)0x7ffffffffffffff;
          }
          pPVar7 = std::
                   _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                   ::_M_allocate(this_01,0x7ffffffffffffff);
          s = local_78;
          *(Identifier **)((long)pPVar7 + uVar10) = pIVar5;
          *(undefined8 *)((long)pPVar7 + uVar10 + 8) = 0;
          pPVar12 = pPVar7;
          for (pPVar9 = local_c0; pPVar11 != pPVar9; pPVar9 = pPVar9 + 1) {
            pAVar2 = pPVar9->def;
            pPVar12->id = pPVar9->id;
            pPVar12->def = pAVar2;
            pPVar12 = pPVar12 + 1;
          }
          if (local_c0 != (pointer)0x0) {
            operator_delete(local_c0,uVar10);
          }
          pPVar11 = pPVar7 + (long)this_01;
          local_c0 = pPVar7;
          local_b8.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar11;
        }
        else {
          pPVar12->id = pIVar5;
          pPVar12->def = (AST *)0x0;
        }
        pPVar12 = pPVar12 + 1;
        local_b8.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity * 4 + 4);
        }
        s = s + 1;
      } while (s != local_70);
    }
    pIVar3 = local_80;
    local_b8.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
    ._M_impl.super__Vector_impl_data._M_start = local_c0;
    VVar13 = makeBuiltin(local_80,&local_50,&local_b8);
    if (local_c0 != (pointer)0x0) {
      operator_delete(local_c0,(long)local_b8.
                                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_c0);
    }
    (pIVar3->scratch).t = FUNCTION;
    (pIVar3->scratch).v = VVar13._0_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinNative(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "native", args, {Value::STRING});

        std::string builtin_name = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        VmNativeCallbackMap::const_iterator nit = nativeCallbacks.find(builtin_name);
        if (nit == nativeCallbacks.end()) {
            scratch = makeNull();
        } else {
            const VmNativeCallback &cb = nit->second;
            scratch = makeNativeBuiltin(builtin_name, cb.params);
        }
        return nullptr;
    }